

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::Branch::fire(Branch *this)

{
  bool bVar1;
  PromiseNode *pPVar2;
  Event *extraout_RDX;
  anon_class_8_1_8f3fef32 *extraout_RDX_00;
  anon_class_8_1_8f3fef32 *extraout_RDX_01;
  anon_class_8_1_8f3fef32 *func;
  Event *extraout_RDX_02;
  Event *pEVar3;
  Branch *in_RSI;
  Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> MVar4;
  Branch *local_1e8;
  Maybe<kj::Exception> local_1e0;
  Branch *local_48;
  Branch *otherBranch;
  Branch *__end3;
  Branch *__begin3;
  Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *__range3;
  uint local_20;
  uint count;
  Branch *this_local;
  
  this_local = this;
  if ((in_RSI->parent->armed & 1U) == 0) {
    local_20 = in_RSI->parent->countLeft - 1;
    in_RSI->parent->countLeft = local_20;
    pPVar2 = Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator->(&in_RSI->promise);
    (*(pPVar2->super_PromiseArenaMember)._vptr_PromiseArenaMember[3])(pPVar2,in_RSI->parent->output)
    ;
    bVar1 = Maybe<kj::Exception>::operator==(&in_RSI->parent->output->exception);
    if (bVar1) {
      __begin3 = (Branch *)&in_RSI->parent->branches;
      __end3 = Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::begin
                         ((Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)__begin3);
      otherBranch = Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch>::end
                              ((Array<kj::_::RaceSuccessfulPromiseNodeBase::Branch> *)__begin3);
      func = extraout_RDX_00;
      for (; __end3 != otherBranch; __end3 = __end3 + 1) {
        local_48 = __end3;
        if (in_RSI != __end3) {
          local_1e8 = __end3;
          runCatchingExceptions<kj::_::RaceSuccessfulPromiseNodeBase::Branch::fire()::__0>
                    (&local_1e0,(kj *)&local_1e8,func);
          Maybe<kj::Exception>::~Maybe(&local_1e0);
          func = extraout_RDX_01;
        }
      }
    }
    bVar1 = Maybe<kj::Exception>::operator==(&in_RSI->parent->output->exception);
    if ((bVar1) || (local_20 == 0)) {
      in_RSI->parent->armed = true;
      PromiseNode::OnReadyEvent::arm(&in_RSI->parent->onReadyEvent);
    }
    Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this);
    pEVar3 = extraout_RDX_02;
  }
  else {
    Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>::Maybe
              ((Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_> *)this);
    pEVar3 = extraout_RDX;
  }
  MVar4.ptr.ptr = pEVar3;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<kj::_::Event,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<Event>> RaceSuccessfulPromiseNodeBase::Branch::fire() {
  if (parent.armed) {
    // the parent node has already received the value, no need to bother with
    // anything
    return kj::none;
  }

  auto count = --parent.countLeft;
  promise->get(parent.output);

  if (parent.output.exception == kj::none) {
    // our promise was successful

    // cancel the others, ignore errors caused by cancellations
    for (auto& otherBranch: parent.branches) {
      if (this != &otherBranch) {
        kj::runCatchingExceptions([&]() { otherBranch.promise = nullptr; });
      }
    }
  }

  if (parent.output.exception == kj::none || count == 0) {
    // we're either successful or the only one left, trigger the parent
    parent.armed = true;
    parent.onReadyEvent.arm();
  }

  return kj::none;
}